

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

int SafeDecodeSymbol(HuffmanCode *table,BrotliBitReader *br,uint32_t *result)

{
  int iVar1;
  uint uVar2;
  HuffmanCode *pHVar3;
  uint32_t available_bits;
  uint32_t val;
  uint32_t *result_local;
  BrotliBitReader *br_local;
  HuffmanCode *table_local;
  
  iVar1 = -br->bit_pos_;
  if (iVar1 == -0x40) {
    if (table->bits == '\0') {
      *result = (uint)table->value;
      table_local._4_4_ = 1;
    }
    else {
      table_local._4_4_ = 0;
    }
  }
  else {
    uVar2 = (uint)(br->val_ >> ((byte)br->bit_pos_ & 0x3f));
    pHVar3 = table + (uVar2 & 0xff);
    if (pHVar3->bits < 9) {
      if (iVar1 + 0x40U < (uint)pHVar3->bits) {
        table_local._4_4_ = 0;
      }
      else {
        br->bit_pos_ = (uint)pHVar3->bits + br->bit_pos_;
        *result = (uint)pHVar3->value;
        table_local._4_4_ = 1;
      }
    }
    else if (iVar1 + 0x40U < 9) {
      table_local._4_4_ = 0;
    }
    else {
      pHVar3 = pHVar3 + ((uint)pHVar3->value + ((uVar2 & kBitMask[pHVar3->bits]) >> 8));
      if (iVar1 + 0x38U < (uint)pHVar3->bits) {
        table_local._4_4_ = 0;
      }
      else {
        br->bit_pos_ = pHVar3->bits + 8 + br->bit_pos_;
        *result = (uint)pHVar3->value;
        table_local._4_4_ = 1;
      }
    }
  }
  return table_local._4_4_;
}

Assistant:

static BROTLI_NOINLINE BROTLI_BOOL SafeDecodeSymbol(
    const HuffmanCode* table, BrotliBitReader* br, uint32_t* result) {
  uint32_t val;
  uint32_t available_bits = BrotliGetAvailableBits(br);
  if (available_bits == 0) {
    if (table->bits == 0) {
      *result = table->value;
      return BROTLI_TRUE;
    }
    return BROTLI_FALSE;  /* No valid bits at all. */
  }
  val = (uint32_t)BrotliGetBitsUnmasked(br);
  table += val & HUFFMAN_TABLE_MASK;
  if (table->bits <= HUFFMAN_TABLE_BITS) {
    if (table->bits <= available_bits) {
      BrotliDropBits(br, table->bits);
      *result = table->value;
      return BROTLI_TRUE;
    } else {
      return BROTLI_FALSE;  /* Not enough bits for the first level. */
    }
  }
  if (available_bits <= HUFFMAN_TABLE_BITS) {
    return BROTLI_FALSE;  /* Not enough bits to move to the second level. */
  }

  /* Speculatively drop HUFFMAN_TABLE_BITS. */
  val = (val & BitMask(table->bits)) >> HUFFMAN_TABLE_BITS;
  available_bits -= HUFFMAN_TABLE_BITS;
  table += table->value + val;
  if (available_bits < table->bits) {
    return BROTLI_FALSE;  /* Not enough bits for the second level. */
  }

  BrotliDropBits(br, HUFFMAN_TABLE_BITS + table->bits);
  *result = table->value;
  return BROTLI_TRUE;
}